

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aec_core.cc
# Opt level: O1

void webrtc::UpdateLevel(PowerLevel *level,float power)

{
  bool bVar1;
  uint uVar2;
  float value;
  
  BlockMeanCalculator::AddValue(&level->framelevel,power);
  bVar1 = BlockMeanCalculator::EndOfBlock(&level->framelevel);
  if (bVar1) {
    value = BlockMeanCalculator::GetLatestMean(&level->framelevel);
    if (0.0 < value) {
      uVar2 = -(uint)(value < level->minlevel);
      level->minlevel = (float)(~uVar2 & (uint)(level->minlevel * 1.001) | uVar2 & (uint)value);
    }
    BlockMeanCalculator::AddValue(&level->averagelevel,value);
    return;
  }
  return;
}

Assistant:

static void UpdateLevel(PowerLevel* level, float power) {
  level->framelevel.AddValue(power);
  if (level->framelevel.EndOfBlock()) {
    const float new_frame_level = level->framelevel.GetLatestMean();
    if (new_frame_level > 0) {
      if (new_frame_level < level->minlevel) {
        level->minlevel = new_frame_level;  // New minimum.
      } else {
        level->minlevel *= (1 + 0.001f);  // Small increase.
      }
    }
    level->averagelevel.AddValue(new_frame_level);
  }
}